

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.c
# Opt level: O2

void AllocateInChuck(Heap *heap,Chuck *chuck,Size size)

{
  Chuck *chuck_00;
  Chuck *chuck_01;
  uint uVar1;
  ulong uVar2;
  Size SVar3;
  ulong uVar4;
  
  MoveOut(heap,chuck);
  uVar2 = (ulong)(*(uint *)&chuck->field_0x4 >> 1);
  if (((&chuck->field_0x4)[uVar2 * 8] & 1) != 0) {
    __assert_fail("!GetUsed(chuck)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/HeapImpl.h"
                  ,0x89,"Chuck *SplitIfWorthy(Chuck *, Size)");
  }
  if (size <= uVar2 * 8) {
    SVar3 = 0x18;
    if (0x18 < size) {
      SVar3 = size;
    }
    uVar4 = SVar3 + 7 & 0xfffffffffffffff8;
    if (uVar2 * 8 < uVar4 + 0x18) {
      return;
    }
    SetSize(chuck,uVar4);
    uVar4 = (ulong)(*(uint *)&chuck->field_0x4 >> 1);
    chuck_00 = (Chuck *)(&chuck->lowerSize + uVar4 * 2);
    *(uint *)&chuck_00->field_0x4 = *(uint *)&chuck_00->field_0x4 & 0xfffffffe;
    SetSize(chuck,uVar4 << 3);
    SetHigher(chuck_00,(Chuck *)(&chuck->lowerSize + uVar2 * 2));
    chuck_01 = (Chuck *)(&chuck_00->lowerSize + (ulong)(*(uint *)&chuck_00->field_0x4 >> 1) * 2);
    if (((&chuck_01->field_0x4)[(ulong)(*(uint *)&chuck_01->field_0x4 >> 1) * 8] & 1) == 0) {
      MoveOut(heap,chuck_01);
      uVar1 = *(uint *)&chuck_00->field_0x4 >> 1;
      SetHigher(chuck_00,(Chuck *)(&chuck_00->lowerSize +
                                  (ulong)uVar1 * 2 +
                                  (ulong)(*(uint *)(&chuck_00->field_0x4 + (ulong)uVar1 * 8) >> 1) *
                                  2));
    }
    MoveIn(heap,chuck_00);
    return;
  }
  __assert_fail("size <= GetSize(chuck)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/HeapImpl.h"
                ,0x8a,"Chuck *SplitIfWorthy(Chuck *, Size)");
}

Assistant:

static void AllocateInChuck(Heap *heap, Chuck *chuck, Size size) {
    MoveOut(heap, chuck);
    Chuck *remain = SplitIfWorthy(chuck, size);
    if (remain) {
        if (!GetUsed(GetHigher(remain))) {
            MoveOut(heap, GetHigher(remain));
            SetHigher(remain, GetHigher(GetHigher(remain)));
        }
        MoveIn(heap, remain);
    }
}